

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O2

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::Vector<double,_4U>_>::correlateFrames
          (TimeCorrFunc<OpenMD::Vector<double,_4U>_> *this,int frame1,int frame2,int timeBin)

{
  int *piVar1;
  pointer pvVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer piVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  vector<int,_std::allocator<int>_> s2;
  vector<int,_std::allocator<int>_> s1;
  Vector<double,_4U> corrVal;
  Vector<double,_4U> zeroType;
  _Vector_base<int,_std::allocator<int>_> local_d8;
  _Vector_base<int,_std::allocator<int>_> local_b8;
  long local_a0;
  long local_98;
  Vector<double,_4U> local_90;
  Vector<double,_4U> local_70;
  Vector<double,_4U> local_50;
  
  local_b8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.data_[0] = 0.0;
  Vector<double,_4U>::Vector(&local_90,local_50.data_);
  local_70.data_[0] = 0.0;
  Vector<double,_4U>::Vector(&local_50,local_70.data_);
  if (this->doSystemProperties_ == true) {
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xc])
              (&local_70,this,(ulong)(uint)frame1,(ulong)(uint)frame2);
    Vector<double,_4U>::operator=(&local_90,&local_70);
    Vector<double,_4U>::add
              ((this->histogram_).
               super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
               ._M_impl.super__Vector_impl_data._M_start + timeBin,&local_90);
    piVar8 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + timeBin;
    *piVar8 = *piVar8 + 1;
  }
  else {
    local_98 = (long)frame1 * 0x18;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&local_b8,
               (this->sele1ToIndex_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + frame1);
    if (this->uniqueSelections_ == true) {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&local_d8,
                 (this->sele2ToIndex_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + frame2);
    }
    else {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&local_d8,
                 (this->sele1ToIndex_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + frame2);
    }
    local_a0 = (long)frame2 * 0x18;
    piVar3 = local_b8._M_impl.super__Vector_impl_data._M_start;
    piVar5 = local_d8._M_impl.super__Vector_impl_data._M_start;
    while ((piVar3 != local_b8._M_impl.super__Vector_impl_data._M_finish &&
           (piVar5 != local_d8._M_impl.super__Vector_impl_data._M_finish))) {
      lVar6 = -(long)piVar3;
      for (piVar8 = piVar3;
          (piVar8 != local_b8._M_impl.super__Vector_impl_data._M_finish && (*piVar8 < *piVar5));
          piVar8 = piVar8 + 1) {
        lVar6 = lVar6 + -4;
        piVar3 = piVar3 + 1;
      }
      lVar7 = -(long)piVar5;
      piVar9 = piVar5;
      while( true ) {
        if (piVar9 == local_d8._M_impl.super__Vector_impl_data._M_finish) goto LAB_0014a948;
        if (*piVar8 <= *piVar9) break;
        piVar9 = piVar9 + 1;
        lVar7 = lVar7 + -4;
        piVar5 = piVar5 + 1;
      }
      if ((piVar8 == local_b8._M_impl.super__Vector_impl_data._M_finish) ||
         (piVar9 == local_d8._M_impl.super__Vector_impl_data._M_finish)) break;
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        pvVar2 = (this->selection1StartFrame_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = pvVar2;
        if (this->uniqueSelections_ != false) {
          pvVar4 = (this->selection2StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        if (*(int *)((*(long *)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start + local_98) -
                     (long)local_b8._M_impl.super__Vector_impl_data._M_start) + (long)piVar3) !=
            *(int *)((*(long *)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start + local_a0) -
                     (long)local_d8._M_impl.super__Vector_impl_data._M_start) + (long)piVar5))
        break;
        (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x13])
                  (&local_70,this,(ulong)(uint)frame1,(ulong)(uint)frame2,
                   (ulong)-((long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar6) >> 2 &
                   0xffffffff,
                   (ulong)-((long)local_d8._M_impl.super__Vector_impl_data._M_start + lVar7) >> 2 &
                   0xffffffff);
        Vector<double,_4U>::operator=(&local_90,&local_70);
      }
      else {
        (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x13])
                  (&local_70,this,(ulong)(uint)frame1,(ulong)(uint)frame2,
                   (ulong)-(lVar6 + (long)local_b8._M_impl.super__Vector_impl_data._M_start) >> 2,
                   (ulong)-(lVar7 + (long)local_d8._M_impl.super__Vector_impl_data._M_start) >> 2);
        Vector<double,_4U>::operator=(&local_90,&local_70);
      }
      Vector<double,_4U>::add
                ((this->histogram_).
                 super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + timeBin,&local_90);
      piVar1 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + timeBin;
      *piVar1 = *piVar1 + 1;
      piVar3 = piVar8 + 1;
      piVar5 = piVar9 + 1;
    }
  }
LAB_0014a948:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
  return;
}

Assistant:

void TimeCorrFunc<T>::correlateFrames(int frame1, int frame2, int timeBin) {
    std::vector<int> s1;
    std::vector<int> s2;

    std::vector<int>::iterator i1;
    std::vector<int>::iterator i2;

    T corrVal(0.0);
    T zeroType(0.0);

    if (doSystemProperties_) {
      corrVal = calcCorrVal(frame1, frame2);
      histogram_[timeBin] += corrVal;
      count_[timeBin]++;

    } else {
      s1 = sele1ToIndex_[frame1];

      if (uniqueSelections_)
        s2 = sele2ToIndex_[frame2];
      else
        s2 = sele1ToIndex_[frame2];

      for (i1 = s1.begin(), i2 = s2.begin(); i1 != s1.end() && i2 != s2.end();
           ++i1, ++i2) {
        // If the selections are dynamic, they might not have the
        // same objects in both frames, so we need to roll either of
        // the selections until we have the same object to
        // correlate.

        while (i1 != s1.end() && *i1 < *i2) {
          ++i1;
        }

        while (i2 != s2.end() && *i2 < *i1) {
          ++i2;
        }

        if (i1 == s1.end() || i2 == s2.end()) break;

	if (selectionModeRestart_) {
	  
	  int ssf1 = selection1StartFrame_[frame1][i1 - s1.begin()];
	  int ssf2 = uniqueSelections_ ?
	    selection2StartFrame_[frame2][i2 - s2.begin()] :
	    selection1StartFrame_[frame2][i2 - s2.begin()];


	  if (ssf1 != ssf2) break;
	  corrVal = calcCorrVal(frame1, frame2,
				i1 - s1.begin(), i2 - s2.begin());	  
	} else {
	  
	  corrVal = calcCorrVal(frame1, frame2,
				i1 - s1.begin(), i2 - s2.begin());        
	}
        histogram_[timeBin] += corrVal;
        count_[timeBin]++;
      }
    }
  }